

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void highbd_build_non_directional_intra_predictors
               (uint8_t *ref8,int ref_stride,uint8_t *dst8,int dst_stride,PREDICTION_MODE mode,
               TX_SIZE tx_size,int n_top_px,int n_left_px,int bit_depth)

{
  byte bVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uint16_t *left_col;
  uint16_t *above_row;
  uint16_t above_data [160];
  uint16_t left_data [160];
  int val;
  int base;
  uint16_t *left_ref;
  uint16_t *above_ref;
  int need_above_left;
  int need_above;
  int need_left;
  int txhpx;
  int txwpx;
  uint16_t *ref;
  uint16_t *dst;
  int i;
  uint local_318;
  uint local_314;
  undefined1 local_2e8 [30];
  ushort local_2ca;
  uint16_t auStack_2c8 [144];
  undefined1 local_1a8 [30];
  ushort local_18a;
  uint16_t auStack_188 [144];
  uint local_68;
  int local_64;
  ushort *local_60;
  ushort *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  int local_40;
  int local_3c;
  long local_38;
  uint16_t *local_30;
  int local_24;
  byte local_1e;
  byte local_1d;
  int local_1c;
  int local_c;
  
  local_24 = 0;
  local_30 = (uint16_t *)(in_RDX << 1);
  local_38 = in_RDI * 2;
  local_3c = tx_size_wide[in_R9B];
  local_40 = tx_size_high[in_R9B];
  bVar1 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B];
  local_44 = bVar1 & 2;
  local_48 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 4;
  local_4c = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 0x10;
  local_58 = (ushort *)(local_38 + (long)in_ESI * -2);
  local_60 = (ushort *)(local_38 + -2);
  local_64 = 0x80 << ((char)in_stack_00000018 - 8U & 0x1f);
  local_1c = in_ECX;
  if (((("\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 4) == 0) &&
      (in_stack_00000010 == 0)) || (((bVar1 & 2) == 0 && (in_stack_00000008 == 0)))) {
    if ((bVar1 & 2) == 0) {
      if (in_stack_00000010 < 1) {
        local_318 = local_64 - 1;
      }
      else {
        local_318 = (uint)*local_60;
      }
      local_68 = local_318;
    }
    else {
      if (in_stack_00000008 < 1) {
        local_314 = local_64 + 1;
      }
      else {
        local_314 = (uint)*local_58;
      }
      local_68 = local_314;
    }
    for (local_24 = 0; local_24 < local_40; local_24 = local_24 + 1) {
      aom_memset16(local_30,local_68,(long)local_3c);
      local_30 = local_30 + local_1c;
    }
  }
  else {
    local_1e = in_R9B;
    local_1d = in_R8B;
    if ((bVar1 & 2) != 0) {
      local_c = in_ESI;
      aom_memset16(local_1a8,local_64 + 1,0xa0);
      if (in_stack_00000010 < 1) {
        if (0 < in_stack_00000008) {
          aom_memset16(auStack_188,(uint)*local_58,(long)local_40);
        }
      }
      else {
        for (local_24 = 0; local_24 < in_stack_00000010; local_24 = local_24 + 1) {
          auStack_188[local_24] = local_60[local_24 * local_c];
        }
        if (local_24 < local_40) {
          aom_memset16(auStack_188 + local_24,(uint)auStack_188[local_24 + -1],
                       (long)(local_40 - local_24));
        }
      }
    }
    if (local_48 != 0) {
      aom_memset16(local_2e8,local_64 + -1,0xa0);
      if (in_stack_00000008 < 1) {
        if (0 < in_stack_00000010) {
          aom_memset16(auStack_2c8,(uint)*local_60,(long)local_3c);
        }
      }
      else {
        memcpy(auStack_2c8,local_58,(long)in_stack_00000008 << 1);
        local_24 = in_stack_00000008;
        if (in_stack_00000008 < local_3c) {
          aom_memset16(auStack_2c8 + in_stack_00000008,(uint)auStack_2c8[in_stack_00000008 + -1],
                       (long)(local_3c - in_stack_00000008));
        }
      }
    }
    if (local_4c != 0) {
      if ((in_stack_00000008 < 1) || (in_stack_00000010 < 1)) {
        if (in_stack_00000008 < 1) {
          if (in_stack_00000010 < 1) {
            local_2ca = (ushort)local_64;
          }
          else {
            local_2ca = *local_60;
          }
        }
        else {
          local_2ca = *local_58;
        }
      }
      else {
        local_2ca = local_58[-1];
      }
      local_18a = local_2ca;
    }
    if (local_1d == 0) {
      (*dc_pred_high[(int)(uint)(0 < in_stack_00000010)][(int)(uint)(0 < in_stack_00000008)]
        [local_1e])(local_30,(long)local_1c,auStack_2c8,auStack_188,in_stack_00000018);
    }
    else {
      (*pred_high[local_1d][local_1e])
                (local_30,(long)local_1c,auStack_2c8,auStack_188,in_stack_00000018);
    }
  }
  return;
}

Assistant:

static void highbd_build_non_directional_intra_predictors(
    const uint8_t *ref8, int ref_stride, uint8_t *dst8, int dst_stride,
    PREDICTION_MODE mode, TX_SIZE tx_size, int n_top_px, int n_left_px,
    int bit_depth) {
  int i = 0;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const uint16_t *const ref = CONVERT_TO_SHORTPTR(ref8);
  const int txwpx = tx_size_wide[tx_size];
  const int txhpx = tx_size_high[tx_size];
  int need_left = extend_modes[mode] & NEED_LEFT;
  int need_above = extend_modes[mode] & NEED_ABOVE;
  int need_above_left = extend_modes[mode] & NEED_ABOVELEFT;
  const uint16_t *above_ref = ref - ref_stride;
  const uint16_t *left_ref = ref - 1;
  const int base = 128 << (bit_depth - 8);

  assert(n_top_px >= 0);
  assert(n_left_px >= 0);
  assert(mode == DC_PRED || mode == SMOOTH_PRED || mode == SMOOTH_V_PRED ||
         mode == SMOOTH_H_PRED || mode == PAETH_PRED);

  if ((!need_above && n_left_px == 0) || (!need_left && n_top_px == 0)) {
    int val = 0;
    if (need_left) {
      val = (n_top_px > 0) ? above_ref[0] : base + 1;
    } else {
      val = (n_left_px > 0) ? left_ref[0] : base - 1;
    }
    for (i = 0; i < txhpx; ++i) {
      aom_memset16(dst, val, txwpx);
      dst += dst_stride;
    }
    return;
  }

  DECLARE_ALIGNED(16, uint16_t, left_data[NUM_INTRA_NEIGHBOUR_PIXELS]);
  DECLARE_ALIGNED(16, uint16_t, above_data[NUM_INTRA_NEIGHBOUR_PIXELS]);
  uint16_t *const above_row = above_data + 16;
  uint16_t *const left_col = left_data + 16;

  if (need_left) {
    aom_memset16(left_data, base + 1, NUM_INTRA_NEIGHBOUR_PIXELS);
    if (n_left_px > 0) {
      for (i = 0; i < n_left_px; i++) left_col[i] = left_ref[i * ref_stride];
      if (i < txhpx) aom_memset16(&left_col[i], left_col[i - 1], txhpx - i);
    } else if (n_top_px > 0) {
      aom_memset16(left_col, above_ref[0], txhpx);
    }
  }

  if (need_above) {
    aom_memset16(above_data, base - 1, NUM_INTRA_NEIGHBOUR_PIXELS);
    if (n_top_px > 0) {
      memcpy(above_row, above_ref, n_top_px * sizeof(above_ref[0]));
      i = n_top_px;
      if (i < txwpx) aom_memset16(&above_row[i], above_row[i - 1], (txwpx - i));
    } else if (n_left_px > 0) {
      aom_memset16(above_row, left_ref[0], txwpx);
    }
  }

  if (need_above_left) {
    if (n_top_px > 0 && n_left_px > 0) {
      above_row[-1] = above_ref[-1];
    } else if (n_top_px > 0) {
      above_row[-1] = above_ref[0];
    } else if (n_left_px > 0) {
      above_row[-1] = left_ref[0];
    } else {
      above_row[-1] = base;
    }
    left_col[-1] = above_row[-1];
  }

  if (mode == DC_PRED) {
    dc_pred_high[n_left_px > 0][n_top_px > 0][tx_size](
        dst, dst_stride, above_row, left_col, bit_depth);
  } else {
    pred_high[mode][tx_size](dst, dst_stride, above_row, left_col, bit_depth);
  }
}